

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

int __thiscall
CNetBan::Unban<CNetBan::CBanPool<CNetRange,16>>
          (CNetBan *this,CBanPool<CNetRange,_16> *pBanPool,CDataType *pData)

{
  long lVar1;
  CBan<CNetRange> *pBan;
  int iVar2;
  long in_FS_OFFSET;
  CNetHash NetHash;
  char aBuf [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetHash::CNetHash(&NetHash,pData);
  pBan = CBanPool<CNetRange,_16>::Find(pBanPool,pData,&NetHash);
  if (pBan == (CBan<CNetRange> *)0x0) {
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban","unban failed (invalid entry)",0);
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    MakeBanInfo<CNetRange>(this,pBan,aBuf,0x100,3,(int *)0x0);
    CBanPool<CNetRange,_16>::Remove(pBanPool,pBan);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban",aBuf,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CNetBan::Unban(T *pBanPool, const typename T::CDataType *pData)
{
	CNetHash NetHash(pData);
	CBan<typename T::CDataType> *pBan = pBanPool->Find(pData, &NetHash);
	if(pBan)
	{
		char aBuf[256];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_BANREM);
		pBanPool->Remove(pBan);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 0;
	}
	else
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban failed (invalid entry)");
	return -1;
}